

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

void __thiscall btQuantizedBvh::btQuantizedBvh(btQuantizedBvh *this)

{
  undefined8 *in_RDI;
  btAlignedObjectArray<btOptimizedBvhNode> *in_stack_ffffffffffffffa0;
  btScalar local_2c;
  btScalar local_28;
  btScalar local_24;
  btScalar local_20;
  btScalar local_1c;
  btScalar local_18 [6];
  
  *in_RDI = &PTR__btQuantizedBvh_002e23d8;
  btVector3::btVector3((btVector3 *)(in_RDI + 1));
  btVector3::btVector3((btVector3 *)(in_RDI + 3));
  btVector3::btVector3((btVector3 *)(in_RDI + 5));
  *(undefined4 *)(in_RDI + 7) = 0x11c;
  *(undefined1 *)(in_RDI + 8) = 0;
  btAlignedObjectArray<btOptimizedBvhNode>::btAlignedObjectArray(in_stack_ffffffffffffffa0);
  btAlignedObjectArray<btOptimizedBvhNode>::btAlignedObjectArray(in_stack_ffffffffffffffa0);
  btAlignedObjectArray<btQuantizedBvhNode>::btAlignedObjectArray
            ((btAlignedObjectArray<btQuantizedBvhNode> *)in_stack_ffffffffffffffa0);
  btAlignedObjectArray<btQuantizedBvhNode>::btAlignedObjectArray
            ((btAlignedObjectArray<btQuantizedBvhNode> *)in_stack_ffffffffffffffa0);
  *(undefined4 *)(in_RDI + 0x19) = 0;
  btAlignedObjectArray<btBvhSubtreeInfo>::btAlignedObjectArray
            ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0x1a));
  *(undefined4 *)(in_RDI + 0x1e) = 0;
  local_18[0] = -3.4028235e+38;
  local_1c = -3.4028235e+38;
  local_20 = -3.4028235e+38;
  btVector3::setValue((btVector3 *)(in_RDI + 1),local_18,&local_1c,&local_20);
  local_24 = 3.4028235e+38;
  local_28 = 3.4028235e+38;
  local_2c = 3.4028235e+38;
  btVector3::setValue((btVector3 *)(in_RDI + 3),&local_24,&local_28,&local_2c);
  return;
}

Assistant:

btQuantizedBvh::btQuantizedBvh() : 
					m_bulletVersion(BT_BULLET_VERSION),
					m_useQuantization(false), 
					//m_traversalMode(TRAVERSAL_STACKLESS_CACHE_FRIENDLY)
					m_traversalMode(TRAVERSAL_STACKLESS)
					//m_traversalMode(TRAVERSAL_RECURSIVE)
					,m_subtreeHeaderCount(0) //PCK: add this line
{
	m_bvhAabbMin.setValue(-SIMD_INFINITY,-SIMD_INFINITY,-SIMD_INFINITY);
	m_bvhAabbMax.setValue(SIMD_INFINITY,SIMD_INFINITY,SIMD_INFINITY);
}